

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O3

void __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::InitQueue(S2ClosestEdgeQueryBase<S2MinDistance> *this)

{
  ulong uVar1;
  Iterator *this_00;
  S2CellId SVar2;
  long lVar3;
  size_type sVar4;
  bool bVar5;
  CellRelation CVar6;
  reference ppSVar7;
  pointer pSVar8;
  S2ShapeIndexCell *index_cell;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  size_type sVar14;
  double dVar15;
  S1ChordAngle b;
  S2Cap cap;
  S2RegionCoverer coverer;
  S2Cap search_cap;
  undefined1 local_e8 [8];
  S2Point local_e0;
  S1ChordAngle local_c8;
  S2LogMessage local_c0;
  undefined1 local_b0 [16];
  S2ShapeIndexCell *local_a0;
  S2Region local_58;
  S2Point local_50;
  double local_38;
  
  if (1 < (this->queue_).c.allocator_and_tag_.tag_.size_) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)local_b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_edge_query_base.h"
               ,0x2b5,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_b0._8_8_,"Check failed: queue_.empty() ",0x1d);
LAB_001b6aa4:
    abort();
  }
  if ((this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    S2ShapeIndex::Iterator::Init(&this->iter_,this->index_,UNPOSITIONED);
  }
  (*this->target_->_vptr_S2DistanceTarget[2])(local_e8);
  if (0.0 <= local_c8.length2_) {
    if (this->options_->max_results_ == 1) {
      bVar5 = S2ShapeIndex::Iterator::Locate(&this->iter_,&local_e0);
      if (bVar5) {
        S1ChordAngle::S1ChordAngle((S1ChordAngle *)local_b0,0.0);
        SVar2.id_ = (((this->iter_).iter_._M_t.
                      super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                      .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)->id_
                    ).id_;
        local_a0 = S2ShapeIndex::Iterator::cell(&this->iter_);
        local_b0._8_8_ = SVar2.id_;
        ProcessEdges(this,(QueueEntry *)local_b0);
        dVar15 = (this->distance_limit_).super_S1ChordAngle.length2_;
        S1ChordAngle::S1ChordAngle((S1ChordAngle *)local_b0,0.0);
        if ((dVar15 == (double)local_b0._0_8_) && (!NAN(dVar15) && !NAN((double)local_b0._0_8_))) {
          return;
        }
      }
    }
    if ((this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      InitCovering(this);
    }
    dVar15 = (this->distance_limit_).super_S1ChordAngle.length2_;
    S1ChordAngle::S1ChordAngle((S1ChordAngle *)local_b0,INFINITY);
    if ((dVar15 != (double)local_b0._0_8_) || (NAN(dVar15) || NAN((double)local_b0._0_8_))) {
      S2RegionCoverer::S2RegionCoverer((S2RegionCoverer *)local_b0);
      S2RegionCoverer::Options::set_max_cells((Options *)local_b0,4);
      dVar15 = S1ChordAngle::GetS1AngleConstructorMaxError
                         (&(this->distance_limit_).super_S1ChordAngle);
      b = S1ChordAngle::PlusError(&(this->distance_limit_).super_S1ChordAngle,dVar15);
      local_38 = (double)operator+(local_c8,b);
      local_58._vptr_S2Region = (_func_int **)&PTR__S2Region_002bb758;
      local_50.c_[0] = local_e0.c_[0];
      local_50.c_[1] = local_e0.c_[1];
      local_50.c_[2] = local_e0.c_[2];
      bVar5 = S2::IsUnitLength(&local_50);
      if (!bVar5 || 4.0 < local_38) {
        S2LogMessage::S2LogMessage
                  (&local_c0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.h"
                   ,0xf5,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_c0.stream_,"Check failed: is_valid() ",0x19);
        goto LAB_001b6aa4;
      }
      S2RegionCoverer::GetFastCovering
                ((S2RegionCoverer *)local_b0,&local_58,&this->max_distance_covering_);
      S2CellUnion::GetIntersection
                (&this->index_covering_,&this->max_distance_covering_,&this->initial_cells_);
      pSVar8 = (this->initial_cells_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->initial_cells_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
          super__Vector_impl_data._M_finish != pSVar8) {
        this_00 = &this->iter_;
        uVar9 = 0;
        uVar13 = 0;
        sVar14 = 0;
        do {
          SVar2.id_ = pSVar8[uVar9].id_;
          sVar4 = (long)(int)sVar14;
          do {
            sVar14 = sVar4;
            uVar9 = (this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                    _M_impl.super__Vector_impl_data._M_start[sVar14].id_;
            sVar4 = sVar14 + 1;
          } while ((uVar9 - 1 | uVar9) < SVar2.id_);
          iVar12 = (int)uVar13;
          if (SVar2.id_ == uVar9) {
            ppSVar7 = absl::
                      InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                      ::operator[](&this->index_cells_,sVar14);
            ProcessOrEnqueue(this,SVar2,*ppSVar7);
            uVar13 = (ulong)(iVar12 + 1);
            sVar14 = sVar14 + 1;
          }
          else {
            CVar6 = S2ShapeIndex::Iterator::Locate(this_00,SVar2);
            if (CVar6 == SUBDIVIDED) {
              ProcessOrEnqueue(this,SVar2,(S2ShapeIndexCell *)0x0);
            }
            else if (CVar6 == INDEXED) {
              SVar2.id_ = (((this_00->iter_)._M_t.
                            super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                            .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl
                           )->id_).id_;
              index_cell = S2ShapeIndex::Iterator::cell(this_00);
              ProcessOrEnqueue(this,SVar2,index_cell);
              pSVar8 = (this->initial_cells_).
                       super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                       super__Vector_impl_data._M_start;
              SVar2.id_ = (((this->iter_).iter_._M_t.
                            super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                            .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl
                           )->id_).id_;
              uVar10 = (long)(this->initial_cells_).
                             super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pSVar8 >> 3;
              uVar9 = (long)iVar12;
              uVar11 = (long)(iVar12 + 1);
              if ((ulong)(long)(iVar12 + 1) < uVar10) {
                uVar11 = uVar10;
              }
              do {
                uVar1 = uVar9 + 1;
                uVar13 = uVar11;
                if (uVar10 <= uVar1) break;
                lVar3 = uVar9 + 1;
                uVar9 = uVar1;
                uVar13 = uVar1;
              } while (pSVar8[lVar3].id_ <= (SVar2.id_ - 1 | SVar2.id_));
              goto LAB_001b6a2d;
            }
            uVar13 = (ulong)(iVar12 + 1);
          }
LAB_001b6a2d:
          uVar9 = (ulong)(int)uVar13;
          pSVar8 = (this->initial_cells_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        } while (uVar9 < (ulong)((long)(this->initial_cells_).
                                       super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pSVar8 >> 3
                                ));
      }
      S2RegionCoverer::~S2RegionCoverer((S2RegionCoverer *)local_b0);
    }
    else {
      pSVar8 = (this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
          super__Vector_impl_data._M_finish != pSVar8) {
        sVar14 = 0;
        do {
          SVar2.id_ = pSVar8[sVar14].id_;
          ppSVar7 = absl::
                    InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                    ::operator[](&this->index_cells_,sVar14);
          ProcessOrEnqueue(this,SVar2,*ppSVar7);
          sVar14 = sVar14 + 1;
          pSVar8 = (this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        } while (sVar14 < (ulong)((long)(this->index_covering_).
                                        super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pSVar8 >>
                                 3));
      }
    }
  }
  return;
}

Assistant:

int32 edge_id() const { return edge_id_; }